

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O3

void celero::executor::RunAllExperiments(void)

{
  TestVector *pTVar1;
  size_t sVar2;
  ulong uVar3;
  shared_ptr<celero::Benchmark> bmark;
  shared_ptr<celero::Benchmark> local_40;
  _Head_base<0UL,_celero::TestVector::Impl_*,_false> local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  pTVar1 = TestVector::Instance();
  sVar2 = TestVector::size(pTVar1);
  if (sVar2 != 0) {
    uVar3 = 0;
    do {
      pTVar1 = TestVector::Instance();
      TestVector::operator[]((TestVector *)&local_30,(size_t)pTVar1);
      if (local_30._M_head_impl != (Impl *)0x0) {
        local_40.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_30._M_head_impl;
        local_40.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = local_28;
        if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_28->_M_use_count = local_28->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_28->_M_use_count = local_28->_M_use_count + 1;
          }
        }
        RunExperiments(&local_40);
        if (local_40.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_40.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
      }
      uVar3 = uVar3 + 1;
      pTVar1 = TestVector::Instance();
      sVar2 = TestVector::size(pTVar1);
    } while (uVar3 < sVar2);
  }
  return;
}

Assistant:

void executor::RunAllExperiments()
{
	// Run through all the tests in ascending order.
	for(size_t i = 0; i < celero::TestVector::Instance().size(); i++)
	{
		auto bmark = celero::TestVector::Instance()[i];
		if(bmark != nullptr)
		{
			executor::RunExperiments(bmark);
		}
	}
}